

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

VarSlice * __thiscall kratos::Var::operator[](Var *this,shared_ptr<kratos::Var> *var)

{
  vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
  *this_00;
  pointer psVar1;
  bool bVar2;
  Var *pVVar3;
  int iVar4;
  shared_ptr<kratos::VarSlice> *s;
  pointer psVar5;
  undefined1 unaff_R15 [8];
  bool bVar6;
  Var *local_68;
  element_type *local_60;
  Var *local_58;
  shared_ptr<kratos::Var> *local_50;
  undefined1 local_48 [8];
  shared_ptr<kratos::VarVarSlice> var_slice;
  
  psVar1 = (this->slices_).
           super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_58 = this;
  local_50 = var;
  for (psVar5 = (this->slices_).
                super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
                ._M_impl.super__Vector_impl_data._M_start; bVar2 = psVar5 == psVar1, !bVar2;
      psVar5 = psVar5 + 1) {
    iVar4 = (*(((psVar5->super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_Var).super_IRNode._vptr_IRNode[0x2b])();
    bVar6 = true;
    if ((char)iVar4 != '\0') {
      as<kratos::VarVarSlice>((Var *)local_48);
      bVar6 = *(Var **)((long)local_48 + 0x298) !=
              (local_50->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (!bVar6) {
        unaff_R15 = local_48;
      }
      if (var_slice.super___shared_ptr<kratos::VarVarSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   var_slice.super___shared_ptr<kratos::VarVarSlice,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
    }
    if (!bVar6) break;
  }
  pVVar3 = local_58;
  if (bVar2) {
    this_00 = &local_58->slices_;
    local_68 = local_58;
    local_60 = (local_50->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_48 = (undefined1  [8])0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<kratos::VarVarSlice,std::allocator<kratos::VarVarSlice>,kratos::Var*,kratos::Var*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&var_slice,(VarVarSlice **)local_48,
               (allocator<kratos::VarVarSlice> *)
               ((long)&var_slice.super___shared_ptr<kratos::VarVarSlice,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + 7),&local_68,&local_60);
    std::__shared_ptr<kratos::VarVarSlice,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<kratos::VarVarSlice,kratos::VarVarSlice>
              ((__shared_ptr<kratos::VarVarSlice,(__gnu_cxx::_Lock_policy)2> *)local_48,
               (VarVarSlice *)local_48);
    std::vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
    ::emplace_back<std::shared_ptr<kratos::VarVarSlice>&>
              ((vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
                *)this_00,(shared_ptr<kratos::VarVarSlice> *)local_48);
    if (pVVar3->width_param_ != (Var *)0x0) {
      (*(((VarSlice *)local_48)->super_Var).super_IRNode._vptr_IRNode[0x23])();
    }
    unaff_R15 = local_48;
    if (var_slice.super___shared_ptr<kratos::VarVarSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 var_slice.super___shared_ptr<kratos::VarVarSlice,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    }
  }
  return &((VarVarSlice *)unaff_R15)->super_VarSlice;
}

Assistant:

VarSlice &Var::operator[](const std::shared_ptr<Var> &var) {
    // if there is one already
    for (auto const &s : slices_) {
        if (s->sliced_by_var()) {
            auto const s_ = s->as<VarVarSlice>();
            if (s_->sliced_var() == var.get()) return *s_;
        }
    }
    auto var_slice = ::make_shared<VarVarSlice>(this, var.get());
    slices_.emplace_back(var_slice);
    if (width_param_) {
        var_slice->set_width_param(width_param_);
    }
    return *var_slice;
}